

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuPrivate::ScrollerTearOffItem::paintEvent(ScrollerTearOffItem *this,QPaintEvent *e)

{
  byte bVar1;
  int aleft;
  int atop;
  QRect *pQVar2;
  QWidget *pQVar3;
  QStyle *pQVar4;
  QPaintEvent *in_RSI;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *parent;
  QRect rect;
  QPainter p;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar5;
  undefined1 *local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QPaintEvent::rect(in_RSI);
  local_18 = QWidget::rect((QWidget *)in_RDI);
  bVar1 = QRect::intersects((QRect *)pQVar2);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_20,
                       (QPaintDevice *)&(in_RDI->super_QWidgetPrivate).field_0x10);
    pQVar3 = QWidget::parentWidget((QWidget *)0x6434d8);
    pQVar2 = *(QRect **)&(in_RDI->super_QWidgetPrivate).field_0x28;
    uVar5 = *(undefined4 *)&(in_RDI->super_QWidgetPrivate).field_0x30;
    aleft = QWidget::width((QWidget *)0x6434f7);
    scrollerHeight((QMenuPrivate *)CONCAT44(aleft,in_stack_ffffffffffffff80));
    QRect::QRect(pQVar2,aleft,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                 in_stack_ffffffffffffff78);
    drawScroller(in_RDI,(QPainter *)CONCAT44(uVar5,in_stack_ffffffffffffff90),
                 (Type)((ulong)pQVar2 >> 0x20),(QRect *)CONCAT44(aleft,in_stack_ffffffffffffff80));
    if (*(int *)&(in_RDI->super_QWidgetPrivate).field_0x30 == 0) {
      atop = QWidget::width((QWidget *)0x643569);
      pQVar4 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x1f,0,pQVar3);
      QRect::QRect(pQVar2,aleft,atop,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      if ((*(long *)(*(long *)&(in_RDI->super_QWidgetPrivate).field_0x28 + 0x2a8) != 0) &&
         ((*(byte *)(*(long *)(*(long *)&(in_RDI->super_QWidgetPrivate).field_0x28 + 0x2a8) + 8) & 1
          ) != 0)) {
        scrollerHeight((QMenuPrivate *)CONCAT44(aleft,atop));
        QRect::translate((QRect *)CONCAT44(aleft,atop),in_stack_ffffffffffffff7c,
                         in_stack_ffffffffffffff78);
      }
      drawTearOff(in_RDI,(QPainter *)CONCAT44(uVar5,in_stack_ffffffffffffff90),pQVar2);
    }
    QPainter::~QPainter((QPainter *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::ScrollerTearOffItem::paintEvent(QPaintEvent *e)
{
    if (!e->rect().intersects(rect()))
        return;

    QPainter p(this);
    QWidget *parent = parentWidget();

    //paint scroll up / down arrows
    menuPrivate->drawScroller(&p, scrollType, QRect(0, 0, width(), menuPrivate->scrollerHeight()));
    //paint the tear off
    if (scrollType == QMenuPrivate::ScrollerTearOffItem::ScrollUp) {
        QRect rect(0, 0, width(), parent->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, parent));
        if (menuPrivate->scroll && menuPrivate->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            rect.translate(0, menuPrivate->scrollerHeight());
        menuPrivate->drawTearOff(&p, rect);
    }
}